

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O3

vector<CardType,_std::allocator<CardType>_> * __thiscall
Deck::populateDeck(vector<CardType,_std::allocator<CardType>_> *__return_storage_ptr__,Deck *this)

{
  CardType *pCVar1;
  int *piVar2;
  uint uVar3;
  pointer pCVar4;
  iterator iVar5;
  pointer pCVar6;
  CardType local_3c [3];
  
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar4 = (pointer)0x0;
  if (*this->deckSize < 3) {
    pCVar6 = (pointer)0x0;
  }
  else {
    do {
      local_3c[2] = 0;
      iVar5._M_current =
           (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      pCVar1 = (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar5._M_current == pCVar1) {
        std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                  (__return_storage_ptr__,iVar5,local_3c + 2);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        pCVar1 = (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar5._M_current = INFANTRY;
        iVar5._M_current = iVar5._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current;
      }
      local_3c[1] = 1;
      if (iVar5._M_current == pCVar1) {
        std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                  (__return_storage_ptr__,iVar5,local_3c + 1);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        pCVar1 = (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar5._M_current = ARTILLERY;
        iVar5._M_current = iVar5._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current;
      }
      local_3c[0] = CAVALRY;
      if (iVar5._M_current == pCVar1) {
        std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                  (__return_storage_ptr__,iVar5,local_3c);
      }
      else {
        *iVar5._M_current = CAVALRY;
        (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      uVar3 = (int)pCVar4 + 1;
      pCVar4 = (pointer)(ulong)uVar3;
    } while ((int)uVar3 < *this->deckSize / 3);
    pCVar4 = (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pCVar6 = (__return_storage_ptr__->super__Vector_base<CardType,_std::allocator<CardType>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  }
  piVar2 = (int *)operator_new(4);
  *piVar2 = (int)((ulong)((long)pCVar6 - (long)pCVar4) >> 2);
  this->deckSize = piVar2;
  return __return_storage_ptr__;
}

Assistant:

std::vector<CardType> Deck::populateDeck() {
    std::vector<CardType> deck = {};

    for (int i = 0; i < *Deck::getNumberOfCards() / 3; i++) {
        deck.emplace_back(CardType::INFANTRY);
        deck.emplace_back(CardType::ARTILLERY);
        deck.emplace_back(CardType::CAVALRY);
    }

    Deck::setNumberOfCards(deck.size());

    return deck;
}